

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O1

void __thiscall
Triangle::Triangle(Triangle *this,vec3f v1,vec3f v2,vec3f v3,vec2f vt1,vec2f vt2,vec2f vt3,vec3f vn1
                  ,vec3f vn2,vec3f vn3)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  data_t (*padVar5) [3];
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  mat3f res;
  float local_178;
  float fStack_174;
  float local_c0 [10];
  float local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  data_t local_38;
  
  fVar24 = v3.z;
  fVar23 = v2.z;
  fVar21 = v2.x;
  fVar28 = v2.y;
  fVar26 = v1.z;
  fVar25 = v1.x;
  fVar19 = v1.y;
  (this->super_BasicPrimitive).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_001b6ba0;
  (this->v1).x = (data_t)(int)v1._0_8_;
  (this->v1).y = (data_t)(int)((ulong)v1._0_8_ >> 0x20);
  (this->v1).z = fVar26;
  (this->v2).x = (data_t)(int)v2._0_8_;
  (this->v2).y = (data_t)(int)((ulong)v2._0_8_ >> 0x20);
  (this->v2).z = fVar23;
  (this->v3).x = (data_t)(int)v3._0_8_;
  (this->v3).y = (data_t)(int)((ulong)v3._0_8_ >> 0x20);
  (this->v3).z = fVar24;
  (this->vn1).z = vn1.z;
  (this->vn1).x = (data_t)(int)vn1._0_8_;
  (this->vn1).y = (data_t)(int)((ulong)vn1._0_8_ >> 0x20);
  (this->vn2).x = vn2.x;
  (this->vn2).y = vn2.y;
  (this->vn2).z = vn2.z;
  (this->vn3).x = vn3.x;
  (this->vn3).y = vn3.y;
  (this->vn3).z = vn3.z;
  auVar4._8_4_ = vt2.x;
  auVar4._0_8_ = vt1;
  auVar4._12_4_ = vt2.y;
  this->vt1 = vt1;
  (this->vt2).x = (data_t)(int)auVar4._8_8_;
  (this->vt2).y = (data_t)(int)((ulong)auVar4._8_8_ >> 0x20);
  this->vt3 = vt3;
  fVar17 = (fVar26 - fVar23) * (fVar26 - fVar23) +
           (fVar25 - fVar21) * (fVar25 - fVar21) + (fVar19 - fVar28) * (fVar19 - fVar28);
  *(data_t *)((long)((this->tMatrix).data + 0) + 0) = 0.0;
  *(data_t *)((long)((this->tMatrix).data + 0) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[0] + 2) = 0;
  padVar5 = (this->tMatrix).data;
  *(data_t *)((long)(padVar5 + 1) + 4) = 0.0;
  *(data_t *)((long)(padVar5 + 1) + 8) = 0.0;
  *(data_t *)((long)((this->tMatrix).data + 2) + 0) = 0.0;
  *(data_t *)((long)((this->tMatrix).data + 2) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[2] + 2) = 0;
  (this->planeNormal).y = 0.0;
  (this->planeNormal).z = 0.0;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  if (fVar17 <= 0.0) {
    __assert_fail("norm(v1-v2)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                  ,0x18,
                  "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)"
                 );
  }
  local_178 = v3.x;
  fStack_174 = v3.y;
  fVar17 = (fVar26 - fVar24) * (fVar26 - fVar24) +
           (fVar25 - local_178) * (fVar25 - local_178) +
           (fVar19 - fStack_174) * (fVar19 - fStack_174);
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  if (fVar17 <= 0.0) {
    __assert_fail("norm(v1-v3)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                  ,0x19,
                  "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)"
                 );
  }
  fVar17 = (fVar23 - fVar24) * (fVar23 - fVar24) +
           (fVar21 - local_178) * (fVar21 - local_178) +
           (fVar28 - fStack_174) * (fVar28 - fStack_174);
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  if (fVar17 <= 0.0) {
    __assert_fail("norm(v2-v3)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                  ,0x1a,
                  "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)"
                 );
  }
  fVar21 = fVar21 - fVar25;
  fVar17 = fVar28 - fVar19;
  fVar23 = fVar23 - fVar26;
  fVar18 = fVar23 * fVar23 + fVar21 * fVar21 + fVar17 * fVar17;
  if (fVar18 < 0.0) {
    fVar18 = sqrtf(fVar18);
  }
  else {
    fVar18 = SQRT(fVar18);
  }
  fVar18 = 1.0 / fVar18;
  local_178 = local_178 - fVar25;
  fStack_174 = fStack_174 - fVar19;
  fVar24 = fVar24 - fVar26;
  fVar25 = fVar24 * fVar24 + local_178 * local_178 + fStack_174 * fStack_174;
  if (fVar25 < 0.0) {
    fVar19 = sqrtf(fVar25);
  }
  else {
    fVar19 = SQRT(fVar25);
  }
  fVar19 = 1.0 / fVar19;
  fVar26 = fVar17 * fVar18 * fVar19 * fVar24 - fStack_174 * fVar19 * fVar18 * fVar23;
  fVar27 = fVar18 * fVar23 * local_178 * fVar19 - fVar19 * fVar24 * fVar21 * fVar18;
  fVar19 = fStack_174 * fVar19 * fVar21 * fVar18 - local_178 * fVar19 * fVar17 * fVar18;
  fVar19 = fVar19 * fVar19 + fVar26 * fVar26 + fVar27 * fVar27;
  if (fVar19 < 0.0) {
    fVar19 = sqrtf(fVar19);
  }
  else {
    fVar19 = SQRT(fVar19);
  }
  if (1e-09 < fVar19) {
    fVar18 = fVar17 * fVar24 - fStack_174 * fVar23;
    fVar19 = fVar23 * local_178;
    fVar27 = fVar19 - fVar24 * fVar21;
    fVar22 = fVar21 * fStack_174;
    fVar26 = fVar22 - local_178 * fVar17;
    fVar20 = fVar26 * fVar26 + fVar18 * fVar18 + fVar27 * fVar27;
    if (fVar20 < 0.0) {
      local_98 = fVar27;
      local_88 = fVar18;
      fStack_84 = fVar28;
      fStack_80 = fVar28;
      fStack_7c = fVar28;
      local_78 = fVar26;
      fStack_74 = fVar28;
      local_68 = fVar19;
      fVar20 = sqrtf(fVar20);
      fVar19 = local_68;
      fVar26 = local_78;
      fVar18 = local_88;
      fVar27 = local_98;
    }
    else {
      fVar20 = SQRT(fVar20);
    }
    fVar20 = 1.0 / fVar20;
    fVar26 = fVar26 * fVar20;
    (this->planeNormal).x = fVar18 * fVar20;
    (this->planeNormal).y = fVar27 * fVar20;
    (this->planeNormal).z = fVar26;
    fVar28 = (this->planeNormal).x;
    fVar18 = (this->planeNormal).y;
    if (vn1.z * fVar26 + vn1.x * fVar28 + vn1.y * fVar18 < 0.0) {
      (this->planeNormal).x = -fVar28;
      (this->planeNormal).y = -fVar18;
      (this->planeNormal).z = -fVar26;
    }
    fVar26 = fStack_174 * fVar23 - fVar17 * fVar24;
    fVar19 = fVar24 * fVar21 - fVar19;
    fVar28 = local_178 * fVar17 - fVar22;
    fVar19 = fVar28 * fVar28 + fVar26 * fVar26 + fVar19 * fVar19;
    if (fVar19 < 0.0) {
      fVar19 = sqrtf(fVar19);
    }
    else {
      fVar19 = SQRT(fVar19);
    }
    this->one_by_2S = 1.0 / fVar19;
    if (fVar25 < 0.0) {
      fVar25 = sqrtf(fVar25);
    }
    else {
      fVar25 = SQRT(fVar25);
    }
    fVar25 = 1.0 / fVar25;
    local_c0[2] = fVar17 * fVar25 * fVar24 + -fVar23 * fStack_174 * fVar25;
    local_c0[5] = fVar23 * local_178 * fVar25 + fVar25 * fVar24 * -fVar21;
    local_c0[8] = fStack_174 * fVar25 * fVar21 + local_178 * fVar25 * -fVar17;
    local_c0[0] = fVar21;
    local_c0[1] = local_178;
    local_c0[3] = fVar17;
    local_c0[4] = fStack_174;
    local_c0[6] = fVar23;
    local_c0[7] = fVar24;
    pfVar10 = local_c0 + 8;
    pfVar12 = (float *)&local_58;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0.0;
    uVar7 = 2;
    lVar15 = 0;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      lVar16 = lVar15 + 1;
      lVar8 = lVar16;
      if (lVar16 == 3) {
        lVar8 = 0;
      }
      uVar11 = 2;
      pfVar13 = pfVar12;
      lVar14 = 0;
      do {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar11;
        uVar9 = SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
        lVar1 = lVar14 + 1;
        lVar6 = 0;
        if (lVar14 != 2) {
          lVar6 = lVar1;
        }
        *pfVar13 = (local_c0[lVar8 * 3 + lVar6] *
                    *(float *)((long)pfVar10 +
                              lVar14 * 4 +
                              uVar9 * -3 +
                              (SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                              0xfffffffffffffffcU) * -9) -
                   *(float *)((long)local_c0 + lVar14 * 4 + uVar9 * -3 + lVar8 * 0xc + 8) *
                   local_c0[(ulong)(((int)lVar15 + 2U) % 3) * 3 + lVar6]) *
                   (1.0 / ((-local_178 * fVar17 * local_c0[8] +
                           local_c0[5] * -fVar21 * fVar24 +
                           fVar17 * local_c0[2] * fVar24 +
                           fVar22 * local_c0[8] + local_178 * local_c0[5] * fVar23) -
                          local_c0[2] * fStack_174 * fVar23));
        pfVar13 = pfVar13 + 3;
        uVar11 = uVar11 + 1;
        lVar14 = lVar1;
      } while (lVar1 != 3);
      pfVar12 = pfVar12 + 1;
      pfVar10 = pfVar10 + 3;
      uVar7 = uVar7 + 1;
      lVar15 = lVar16;
    } while (lVar16 != 3);
    (this->tMatrix).data[2][2] = local_38;
    *(undefined8 *)((this->tMatrix).data[1] + 1) = local_48;
    *(undefined8 *)(this->tMatrix).data[2] = uStack_40;
    *(undefined8 *)(this->tMatrix).data[0] = local_58;
    *(undefined8 *)((this->tMatrix).data[0] + 2) = uStack_50;
    return;
  }
  __assert_fail("norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                ,0x1b,
                "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)")
  ;
}

Assistant:

Triangle(vec3f v1, vec3f v2, vec3f v3, vec2f vt1, vec2f vt2, vec2f vt3, vec3f vn1, vec3f vn2, vec3f vn3):
		v1(v1), v2(v2), v3(v3), vn1(vn1), vn2(vn2), vn3(vn3), vt1(vt1), vt2(vt2), vt3(vt3)
	// pre-calculation to accelerate intersection / interpolation computation
	{
		// NOTE: be careful when dealing with tiny triangles!
		assert(norm(v1-v2)>0);
		assert(norm(v1-v3)>0);
		assert(norm(v2-v3)>0);
		assert(norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9);

		planeNormal = normalized(cross(v2-v1, v3-v1));
		// make sure plane normal points outward
		if (dot(planeNormal, vn1) < 0)
			planeNormal *= -1;
		one_by_2S = 1 / norm(cross(v3-v1, v2-v1));
		tMatrix = inverse(mat3f(v2-v1, v3-v1, cross(v2-v1, normalized(v3-v1))));
	}